

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O3

bool __thiscall
cppnet::BufferBlock::GetFreeMemoryBlock
          (BufferBlock *this,void **res1,uint32_t *len1,void **res2,uint32_t *len2)

{
  char *pcVar1;
  uint32_t uVar2;
  
  *res2 = (void *)0x0;
  *res1 = (void *)0x0;
  *len2 = 0;
  *len1 = 0;
  pcVar1 = this->_write;
  if (pcVar1 < this->_read) {
    *res1 = pcVar1;
    *len1 = *(int *)&this->_read - *(int *)&this->_write;
  }
  else {
    if ((pcVar1 == this->_read) && (this->_can_read != false)) {
      return false;
    }
    *res1 = pcVar1;
    *len1 = *(int *)&this->_buffer_end - *(int *)&this->_write;
    pcVar1 = this->_buffer_start;
    uVar2 = *(int *)&this->_read - (int)pcVar1;
    *len2 = uVar2;
    if (uVar2 != 0) {
      *res2 = pcVar1;
      return true;
    }
  }
  return true;
}

Assistant:

bool BufferBlock::GetFreeMemoryBlock(void*& res1, uint32_t& len1, void*& res2, uint32_t& len2) {
    res1 = res2 = nullptr;
    len1 = len2 = 0;

    if (_write >= _read) {
        if (_can_read && _write == _read) {
            return false;
        }
        res1 = _write;
        len1 = (uint32_t)(_buffer_end - _write);

        len2 = (uint32_t)(_read - _buffer_start);
        if(len2 > 0) {
            res2 = _buffer_start;
        }
        return true;

    } else {
        res1 = _write;
        len1 = (uint32_t)(_read - _write);
        return true;
    }
}